

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O3

bool __thiscall
crnlib::dxt_hc::compress
          (dxt_hc *this,color_quad_u8 (*blocks) [16],
          vector<crnlib::dxt_hc::endpoint_indices_details> *endpoint_indices,
          vector<crnlib::dxt_hc::selector_indices_details> *selector_indices,
          vector<unsigned_int> *color_endpoints,vector<unsigned_int> *alpha_endpoints,
          vector<unsigned_int> *color_selectors,vector<unsigned_long_long> *alpha_selectors,
          params *p)

{
  float *pfVar1;
  short sVar2;
  dxt_format dVar3;
  tile_details *ptVar4;
  void *pvVar5;
  color_cluster *pcVar6;
  alpha_cluster *paVar7;
  uint *puVar8;
  unsigned_long_long *puVar9;
  vector<unsigned_int> *pvVar10;
  byte bVar11;
  uint8 uVar12;
  crn_thread_id_t cVar13;
  long lVar14;
  executable_task *pObj;
  float (*pafVar15) [8];
  code *pcVar16;
  elemental_vector *peVar17;
  uint uVar18;
  ulong uVar19;
  int iVar20;
  uint b;
  task_pool *this_00;
  uint uVar21;
  ulong uVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  float fVar27;
  uint uVar28;
  uint uVar30;
  uint uVar31;
  undefined1 auVar29 [16];
  uint uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  uint32 endpoint_1;
  vector<unsigned_short> alpha_selectors_remap;
  vector<unsigned_short> color_selectors_remap;
  vector<unsigned_short> alpha_endpoints_remap;
  uint32 endpoint;
  insert_result insert_result;
  vector<unsigned_short> color_endpoints_remap;
  insert_result insert_result_3;
  uint local_17c;
  undefined1 local_178 [16];
  uint local_168;
  undefined8 local_160;
  elemental_vector local_158;
  elemental_vector local_148;
  elemental_vector local_138;
  vector<unsigned_int> *local_128;
  vector<unsigned_int> *local_120;
  uint *local_118;
  vector<crnlib::dxt_hc::endpoint_indices_details> *local_110;
  undefined1 local_108 [16];
  uint local_f8;
  undefined8 local_f0;
  undefined1 local_e8 [16];
  uint local_d8;
  undefined8 local_d0;
  uint64 local_c8;
  vector<crnlib::dxt_hc::selector_indices_details> *local_c0;
  uint local_b8;
  uint local_b4;
  int local_b0;
  uint local_ac;
  elemental_vector local_a8;
  undefined1 local_98 [16];
  hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  local_88;
  insert_result local_68;
  anon_struct_16_4_e4b8e16b *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_120 = color_endpoints;
  clear(this);
  bVar23 = (uint)(p->m_format + ~cDXN_YX) < 5;
  this->m_has_etc_color_blocks = bVar23;
  this->m_has_subblocks = (uint)(p->m_format + ~cDXN_YX) < 3;
  bVar24 = true;
  if ((p->m_format != cDXT1) && (p->m_format != cDXT5)) {
    bVar24 = bVar23;
  }
  this->m_has_color_blocks = bVar24;
  dVar3 = p->m_format;
  uVar28 = dVar3 + ~cDXT3;
  if ((uVar28 < 9) && ((0x147U >> (uVar28 & 0x1f) & 1) != 0)) {
    this->m_num_alpha_blocks = *(uint *)(&DAT_001b7c30 + (ulong)uVar28 * 4);
  }
  else {
    this->m_num_alpha_blocks = (uint)(dVar3 == cDXN_YX) * 2;
    if ((dVar3 != cDXN_YX) && (bVar24 == false)) {
      return false;
    }
  }
  local_118 = &this->m_num_alpha_blocks;
  this->m_blocks = blocks;
  local_128 = alpha_endpoints;
  cVar13 = crn_get_current_thread_id();
  this->m_main_thread_id = cVar13;
  this->m_pTask_pool = p->m_pTask_pool;
  memcpy(&this->m_params,p,0x158);
  if (p->m_num_levels != 0) {
    pafVar15 = this->m_color_derating;
    uVar22 = 0;
    auVar33 = _DAT_001b7a20;
    do {
      fVar35 = p->m_adaptive_tile_color_psnr_derating;
      if ((uVar22 != 0) && (0.25 < fVar35)) {
        local_98 = ZEXT416((uint)fVar35);
        fVar27 = powf(3.0,(float)(uVar22 & 0xffffffff));
        auVar33 = _DAT_001b7a20;
        fVar35 = 0.25;
        if (0.25 <= (float)local_98._0_4_ / fVar27) {
          fVar35 = (float)local_98._0_4_ / fVar27;
        }
      }
      lVar14 = 0;
      do {
        auVar29._0_4_ =
             ((float)(*(uint *)((long)&DAT_001b7b30 + lVar14) >> 0x10 | 0x53000000) - 5.497642e+11)
             + (float)(*(uint *)((long)&DAT_001b7b30 + lVar14) & 0xffff | 0x4b000000);
        auVar29._4_4_ =
             ((float)(*(uint *)((long)&DAT_001b7b34 + lVar14) >> 0x10 | 0x53000000) - 5.497642e+11)
             + (float)(*(uint *)((long)&DAT_001b7b34 + lVar14) & 0xffff | 0x4b000000);
        auVar29._8_4_ =
             ((float)(*(uint *)(&UNK_001b7b38 + lVar14) >> 0x10 | 0x53000000) - 5.497642e+11) +
             (float)(*(uint *)(&UNK_001b7b38 + lVar14) & 0xffff | 0x4b000000);
        auVar29._12_4_ =
             ((float)(*(uint *)(&UNK_001b7b3c + lVar14) >> 0x10 | 0x53000000) - 5.497642e+11) +
             (float)(*(uint *)(&UNK_001b7b3c + lVar14) & 0xffff | 0x4b000000);
        auVar29 = divps(auVar29,auVar33);
        pfVar1 = (float *)((long)*pafVar15 + lVar14);
        *pfVar1 = auVar29._0_4_ * fVar35 + 0.0;
        pfVar1[1] = auVar29._4_4_ * fVar35 + 0.0;
        pfVar1[2] = auVar29._8_4_ * fVar35 + 0.0;
        pfVar1[3] = auVar29._12_4_ * fVar35 + 0.0;
        lVar14 = lVar14 + 0x10;
      } while (lVar14 != 0x20);
      uVar22 = uVar22 + 1;
      pafVar15 = pafVar15 + 1;
    } while (uVar22 < p->m_num_levels);
  }
  lVar14 = 0;
  do {
    *(float *)((long)this->m_alpha_derating + lVar14) =
         ((float)*(uint *)((long)&DAT_001b7b30 + lVar14) / 3.0) *
         (this->m_params).m_adaptive_tile_alpha_psnr_derating + 0.0;
    auVar33 = _DAT_001b7a40;
    lVar14 = lVar14 + 4;
  } while (lVar14 != 0x20);
  local_98._0_8_ = endpoint_indices;
  uVar28 = 0;
  uVar30 = 1;
  uVar31 = 2;
  uVar32 = 3;
  lVar14 = 0x8d;
  do {
    auVar34._0_4_ =
         ((float)(uVar28 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(uVar28 & 0xffff | 0x4b000000);
    auVar34._4_4_ =
         ((float)(uVar30 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(uVar30 & 0xffff | 0x4b000000);
    auVar34._8_4_ =
         ((float)(uVar31 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(uVar31 & 0xffff | 0x4b000000);
    auVar34._12_4_ =
         ((float)(uVar32 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(uVar32 & 0xffff | 0x4b000000);
    auVar29 = divps(auVar34,auVar33);
    *(undefined1 (*) [16])((long)(this->m_color_derating + -1) + 0xc + lVar14 * 4) = auVar29;
    uVar28 = uVar28 + 4;
    uVar30 = uVar30 + 4;
    uVar31 = uVar31 + 4;
    uVar32 = uVar32 + 4;
    lVar14 = lVar14 + 4;
  } while (lVar14 != 0x18d);
  uVar30 = (this->m_block_weights).m_size;
  uVar28 = (this->m_params).m_num_blocks;
  this->m_num_blocks = uVar28;
  uVar31 = uVar28;
  if (uVar30 != uVar28) {
    if (uVar30 <= uVar28) {
      if ((this->m_block_weights).m_capacity < uVar28) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_block_weights,uVar28,uVar30 + 1 == uVar28,4,
                   (object_mover)0x0,false);
        uVar30 = (this->m_block_weights).m_size;
      }
      memset((this->m_block_weights).m_p + uVar30,0,(ulong)(uVar28 - uVar30) << 2);
      uVar31 = this->m_num_blocks;
    }
    (this->m_block_weights).m_size = uVar28;
  }
  uVar28 = (this->m_block_encodings).m_size;
  if (uVar28 != uVar31) {
    if (uVar28 <= uVar31) {
      if ((this->m_block_encodings).m_capacity < uVar31) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_block_encodings,uVar31,uVar28 + 1 == uVar31,1,
                   (object_mover)0x0,false);
        uVar28 = (this->m_block_encodings).m_size;
      }
      memset((this->m_block_encodings).m_p + uVar28,0,(ulong)(uVar31 - uVar28));
    }
    (this->m_block_encodings).m_size = uVar31;
  }
  lVar14 = 0x668;
  do {
    peVar17 = (elemental_vector *)((long)(this->m_color_derating + -1) + 0xc + lVar14);
    uVar28 = this->m_num_blocks;
    uVar30 = *(uint *)((long)(this->m_color_derating + -1) + 0x14 + lVar14);
    if (uVar30 != uVar28) {
      if (uVar30 <= uVar28) {
        if (*(uint *)((long)(this->m_color_derating + -1) + 0x18 + lVar14) < uVar28) {
          elemental_vector::increase_capacity
                    (peVar17,uVar28,uVar30 + 1 == uVar28,8,(object_mover)0x0,false);
          uVar30 = peVar17->m_size;
        }
        memset((void *)((ulong)uVar30 * 8 + (long)peVar17->m_p),0,(ulong)(uVar28 - uVar30) << 3);
      }
      peVar17->m_size = uVar28;
    }
    lVar14 = lVar14 + 0x10;
  } while (lVar14 != 0x698);
  uVar28 = this->m_num_blocks;
  uVar30 = (this->m_tile_indices).m_size;
  if (uVar30 != uVar28) {
    uVar31 = uVar28;
    if (uVar30 <= uVar28) {
      if ((this->m_tile_indices).m_capacity < uVar28) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_tile_indices,uVar28,uVar30 + 1 == uVar28,4,
                   (object_mover)0x0,false);
        uVar30 = (this->m_tile_indices).m_size;
      }
      memset((this->m_tile_indices).m_p + uVar30,0,(ulong)(uVar28 - uVar30) << 2);
      uVar31 = this->m_num_blocks;
    }
    (this->m_tile_indices).m_size = uVar28;
    uVar28 = uVar31;
  }
  local_110 = &this->m_endpoint_indices;
  uVar30 = (this->m_endpoint_indices).m_size;
  if (uVar30 != uVar28) {
    if (uVar30 <= uVar28) {
      if ((this->m_endpoint_indices).m_capacity < uVar28) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)local_110,uVar28,uVar30 + 1 == uVar28,8,
                   vector<crnlib::dxt_hc::endpoint_indices_details>::object_mover,false);
        uVar30 = (this->m_endpoint_indices).m_size;
      }
      if (uVar28 - uVar30 != 0) {
        memset(local_110->m_p + uVar30,0,(ulong)(uVar28 - uVar30) << 3);
      }
    }
    (this->m_endpoint_indices).m_size = uVar28;
    uVar28 = this->m_num_blocks;
  }
  local_c0 = &this->m_selector_indices;
  uVar30 = (this->m_selector_indices).m_size;
  if (uVar30 != uVar28) {
    if (uVar30 <= uVar28) {
      if ((this->m_selector_indices).m_capacity < uVar28) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)local_c0,uVar28,uVar30 + 1 == uVar28,6,
                   vector<crnlib::dxt_hc::selector_indices_details>::object_mover,false);
        uVar30 = (this->m_selector_indices).m_size;
      }
      if (uVar28 - uVar30 != 0) {
        memset(local_c0->m_p + uVar30,0,(((ulong)(uVar28 - uVar30) * 6 - 6) / 6) * 6 + 6);
      }
    }
    (this->m_selector_indices).m_size = uVar28;
    uVar28 = this->m_num_blocks;
  }
  uVar30 = (this->m_tiles).m_size;
  uVar31 = uVar30 - uVar28;
  if (uVar31 != 0) {
    if (uVar30 < uVar28 || uVar31 == 0) {
      if ((this->m_tiles).m_capacity < uVar28) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this,uVar28,uVar30 + 1 == uVar28,0x48,
                   vector<crnlib::dxt_hc::tile_details>::object_mover,false);
        uVar30 = (this->m_tiles).m_size;
      }
      if (uVar28 - uVar30 != 0) {
        ptVar4 = (this->m_tiles).m_p;
        lVar14 = 0;
        do {
          *(undefined1 (*) [16])((long)ptVar4[uVar30].color_endpoint.m_s + lVar14 + -0x14) =
               (undefined1  [16])0x0;
          lVar14 = lVar14 + 0x48;
        } while ((ulong)(uVar28 - uVar30) * 0x48 != lVar14);
      }
    }
    else {
      ptVar4 = (this->m_tiles).m_p;
      lVar14 = 0;
      do {
        pvVar5 = *(void **)((long)ptVar4[uVar28].color_endpoint.m_s + lVar14 + -0x14);
        if (pvVar5 != (void *)0x0) {
          crnlib_free(pvVar5);
        }
        lVar14 = lVar14 + 0x48;
      } while ((ulong)uVar31 * 0x48 != lVar14);
    }
    (this->m_tiles).m_size = uVar28;
  }
  uVar28 = p->m_num_levels;
  if (uVar28 != 0) {
    uVar22 = 0;
    do {
      uVar30 = p->m_levels[uVar22].m_first_block;
      uVar19 = (ulong)uVar30;
      uVar31 = p->m_levels[uVar22].m_num_blocks + uVar30;
      if (uVar30 < uVar31) {
        fVar35 = p->m_levels[uVar22].m_weight;
        do {
          (this->m_block_weights).m_p[uVar19] = fVar35;
          uVar19 = uVar19 + 1;
        } while (uVar31 != uVar19);
        uVar28 = p->m_num_levels;
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 < uVar28);
  }
  this_00 = this->m_pTask_pool;
  uVar22 = 0;
  do {
    pcVar16 = determine_tiles_task;
    if (this->m_has_subblocks != false) {
      pcVar16 = determine_tiles_task_etc;
    }
    local_c8 = uVar22;
    pObj = (executable_task *)crnlib_malloc(0x28);
    pObj->_vptr_executable_task = (_func_int **)&PTR_execute_task_001db950;
    pObj[1]._vptr_executable_task = (_func_int **)this;
    pObj[2]._vptr_executable_task = (_func_int **)pcVar16;
    pObj[3]._vptr_executable_task = (_func_int **)0x0;
    *(undefined4 *)&pObj[4]._vptr_executable_task = 1;
    task_pool::queue_task(this_00,pObj,local_c8,(void *)0x0);
    uVar28 = (int)uVar22 + 1;
    uVar22 = (ulong)uVar28;
    this_00 = this->m_pTask_pool;
  } while (uVar28 <= this_00->m_num_threads);
  task_pool::join(this_00);
  pvVar10 = local_120;
  this->m_num_tiles = 0;
  uVar22 = (ulong)(this->m_tiles).m_size;
  if (uVar22 != 0) {
    ptVar4 = (this->m_tiles).m_p;
    lVar14 = 0;
    uVar18 = 0;
    do {
      if (*(int *)((long)(ptVar4->color_endpoint).m_s + lVar14 + -0xc) != 0) {
        uVar18 = uVar18 + 1;
        this->m_num_tiles = uVar18;
      }
      lVar14 = lVar14 + 0x48;
    } while (uVar22 * 0x48 != lVar14);
  }
  if (this->m_has_color_blocks != false) {
    determine_color_endpoints(this);
  }
  if (*local_118 != 0) {
    determine_alpha_endpoints(this);
  }
  if (this->m_has_color_blocks == true) {
    create_color_selector_codebook(this);
  }
  if (*local_118 != 0) {
    create_alpha_selector_codebook(this);
  }
  vector<unsigned_int>::reserve(pvVar10,(this->m_color_clusters).m_size + pvVar10->m_size);
  uVar18 = (this->m_color_clusters).m_size;
  local_a8.m_p = (void *)0x0;
  local_a8.m_size = 0;
  local_a8.m_capacity = 0;
  if (uVar18 == 0) {
    local_88.m_values.m_p = (raw_node *)0x0;
    local_88.m_values.m_size = 0;
    local_88.m_values.m_capacity = 0;
    local_88.m_hash_shift = 0x20;
    local_88.m_num_valid = 0;
    local_88.m_grow_threshold = 0;
  }
  else {
    elemental_vector::increase_capacity(&local_a8,uVar18,uVar18 == 1,2,(object_mover)0x0,false);
    memset((void *)((ulong)local_a8.m_size * 2 + (long)local_a8.m_p),0,
           (ulong)(uVar18 - local_a8.m_size) * 2);
    local_a8.m_size = uVar18;
    uVar28 = (this->m_color_clusters).m_size;
    local_88.m_values.m_p = (raw_node *)0x0;
    local_88.m_values.m_size = 0;
    local_88.m_values.m_capacity = 0;
    local_88.m_hash_shift = 0x20;
    local_88.m_num_valid = 0;
    local_88.m_grow_threshold = 0;
    if (uVar28 != 0) {
      lVar14 = 0x22;
      uVar22 = 0;
      do {
        pcVar6 = (this->m_color_clusters).m_p;
        if (*(int *)((long)pcVar6->blocks + lVar14 * 2 + -0xc) != 0) {
          uVar18 = *(uint *)((long)pcVar6->blocks + lVar14 * 2 + -4);
          if (this->m_has_etc_color_blocks == false) {
            uVar18 = dxt1_block::pack_endpoints
                               (uVar18,*(uint *)((long)&pcVar6->blocks[0].m_p + lVar14 * 2));
          }
          local_108._0_4_ = uVar18;
          local_178._0_4_ = pvVar10->m_size;
          hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
          ::insert((insert_result *)local_e8,&local_88,(uint *)local_108,(uint *)local_178);
          if (local_d8._0_1_ == true) {
            *(short *)((long)local_a8.m_p + uVar22 * 2) = (short)pvVar10->m_size;
            uVar28 = pvVar10->m_size;
            if (pvVar10->m_capacity <= uVar28) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)pvVar10,uVar28 + 1,true,4,(object_mover)0x0,false);
              uVar28 = pvVar10->m_size;
            }
            pvVar10->m_p[uVar28] = local_108._0_4_;
            pvVar10->m_size = pvVar10->m_size + 1;
          }
          else {
            *(undefined2 *)((long)local_a8.m_p + uVar22 * 2) =
                 *(undefined2 *)
                  (((node_vector *)local_e8._0_8_)->m_p[(uint)local_e8._8_4_].m_bits + 4);
          }
          uVar28 = (this->m_color_clusters).m_size;
        }
        uVar22 = uVar22 + 1;
        lVar14 = lVar14 + 0x2c;
      } while (uVar22 < uVar28);
    }
  }
  pvVar10 = local_128;
  vector<unsigned_int>::reserve(local_128,(this->m_alpha_clusters).m_size + local_128->m_size);
  uVar18 = (this->m_alpha_clusters).m_size;
  local_138.m_p = (void *)0x0;
  local_138.m_size = 0;
  local_138.m_capacity = 0;
  if (uVar18 == 0) {
    local_e8._0_8_ = (raw_node *)0x0;
    local_e8._8_4_ = 0;
    local_e8._12_4_ = 0;
    local_d8 = 0x20;
    local_d0._0_4_ = 0;
    local_d0._4_4_ = 0;
  }
  else {
    elemental_vector::increase_capacity(&local_138,uVar18,uVar18 == 1,2,(object_mover)0x0,false);
    memset((void *)((ulong)local_138.m_size * 2 + (long)local_138.m_p),0,
           (ulong)(uVar18 - local_138.m_size) * 2);
    local_138.m_size = uVar18;
    uVar28 = (this->m_alpha_clusters).m_size;
    local_e8._0_8_ = (raw_node *)0x0;
    local_e8._8_4_ = 0;
    local_e8._12_4_ = 0;
    local_d8 = 0x20;
    local_d0._0_4_ = 0;
    local_d0._4_4_ = 0;
    if (uVar28 != 0) {
      lVar14 = 0x22;
      uVar22 = 0;
      do {
        paVar7 = (this->m_alpha_clusters).m_p;
        if (*(int *)((long)paVar7->blocks + lVar14 * 2 + -0xc) != 0) {
          uVar18 = dxt5_block::pack_endpoints
                             (*(uint *)((long)paVar7->blocks + lVar14 * 2 + -4),
                              *(uint *)((long)&paVar7->blocks[0].m_p + lVar14 * 2));
          local_178._0_4_ = uVar18;
          local_68.first.m_pTable._0_4_ = pvVar10->m_size;
          hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
          ::insert((insert_result *)local_108,
                   (hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                    *)local_e8,(uint *)local_178,(uint *)&local_68);
          if (local_f8._0_1_ == true) {
            *(short *)((long)local_138.m_p + uVar22 * 2) = (short)pvVar10->m_size;
            uVar28 = pvVar10->m_size;
            if (pvVar10->m_capacity <= uVar28) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)pvVar10,uVar28 + 1,true,4,(object_mover)0x0,false);
              uVar28 = pvVar10->m_size;
            }
            pvVar10->m_p[uVar28] = local_178._0_4_;
            pvVar10->m_size = pvVar10->m_size + 1;
          }
          else {
            *(undefined2 *)((long)local_138.m_p + uVar22 * 2) =
                 *(undefined2 *)
                  (((node_vector *)local_108._0_8_)->m_p[(uint)local_108._8_4_].m_bits + 4);
          }
          uVar28 = (this->m_alpha_clusters).m_size;
        }
        uVar22 = uVar22 + 1;
        lVar14 = lVar14 + 0x48;
      } while (uVar22 < uVar28);
    }
  }
  vector<unsigned_int>::reserve
            (color_selectors,(this->m_color_selectors).m_size + color_selectors->m_size);
  uVar18 = (this->m_color_selectors).m_size;
  local_148.m_p = (void *)0x0;
  local_148.m_size = 0;
  local_148.m_capacity = 0;
  if (uVar18 == 0) {
    local_108._0_8_ = (raw_node *)0x0;
    local_108._8_4_ = 0;
    local_108._12_4_ = 0;
    local_f8 = 0x20;
    local_f0._0_4_ = 0;
    local_f0._4_4_ = 0;
  }
  else {
    elemental_vector::increase_capacity(&local_148,uVar18,uVar18 == 1,2,(object_mover)0x0,false);
    memset((void *)((ulong)local_148.m_size * 2 + (long)local_148.m_p),0,
           (ulong)(uVar18 - local_148.m_size) * 2);
    local_148.m_size = uVar18;
    uVar28 = (this->m_color_selectors).m_size;
    local_108._0_8_ = (raw_node *)0x0;
    local_108._8_4_ = 0;
    local_108._12_4_ = 0;
    local_f8 = 0x20;
    local_f0._0_4_ = 0;
    local_f0._4_4_ = 0;
    if (uVar28 != 0) {
      uVar22 = 0;
      do {
        if ((this->m_color_selectors_used).m_p[uVar22] == true) {
          local_68.first.m_pTable._0_4_ = color_selectors->m_size;
          hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
          ::insert((insert_result *)local_178,
                   (hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                    *)local_108,(this->m_color_selectors).m_p + uVar22,(uint *)&local_68);
          if (local_168._0_1_ == true) {
            *(short *)((long)local_148.m_p + uVar22 * 2) = (short)color_selectors->m_size;
            puVar8 = (this->m_color_selectors).m_p;
            uVar28 = color_selectors->m_size;
            if (color_selectors->m_capacity <= uVar28) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)color_selectors,uVar28 + 1,true,4,(object_mover)0x0,
                         false);
              uVar28 = color_selectors->m_size;
            }
            color_selectors->m_p[uVar28] = puVar8[uVar22];
            color_selectors->m_size = color_selectors->m_size + 1;
          }
          else {
            *(undefined2 *)((long)local_148.m_p + uVar22 * 2) =
                 *(undefined2 *)
                  (((node_vector *)local_178._0_8_)->m_p[(uint)local_178._8_4_].m_bits + 4);
          }
          uVar28 = (this->m_color_selectors).m_size;
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 < uVar28);
    }
  }
  vector<unsigned_long_long>::reserve
            (alpha_selectors,(this->m_alpha_selectors).m_size + alpha_selectors->m_size);
  uVar18 = (this->m_alpha_selectors).m_size;
  local_158.m_p = (void *)0x0;
  local_158.m_size = 0;
  local_158.m_capacity = 0;
  if (uVar18 == 0) {
    local_178._0_8_ = (raw_node *)0x0;
    local_178._8_4_ = 0;
    local_178._12_4_ = 0;
    local_168 = 0x20;
    local_160._0_4_ = 0;
    local_160._4_4_ = 0;
  }
  else {
    elemental_vector::increase_capacity(&local_158,uVar18,uVar18 == 1,2,(object_mover)0x0,false);
    memset((void *)((ulong)local_158.m_size * 2 + (long)local_158.m_p),0,
           (ulong)(uVar18 - local_158.m_size) * 2);
    local_158.m_size = uVar18;
    uVar28 = (this->m_alpha_selectors).m_size;
    local_178._0_8_ = (raw_node *)0x0;
    local_178._8_4_ = 0;
    local_178._12_4_ = 0;
    local_168 = 0x20;
    local_160._0_4_ = 0;
    local_160._4_4_ = 0;
    if (uVar28 != 0) {
      uVar22 = 0;
      do {
        if ((this->m_alpha_selectors_used).m_p[uVar22] == true) {
          local_17c = alpha_selectors->m_size;
          hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
          ::insert(&local_68,
                   (hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
                    *)local_178,(this->m_alpha_selectors).m_p + uVar22,&local_17c);
          if (local_68.second == true) {
            *(short *)((long)local_158.m_p + uVar22 * 2) = (short)alpha_selectors->m_size;
            puVar9 = (this->m_alpha_selectors).m_p;
            uVar28 = alpha_selectors->m_size;
            if (alpha_selectors->m_capacity <= uVar28) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)alpha_selectors,uVar28 + 1,true,8,(object_mover)0x0,
                         false);
              uVar28 = alpha_selectors->m_size;
            }
            alpha_selectors->m_p[uVar28] = puVar9[uVar22];
            alpha_selectors->m_size = alpha_selectors->m_size + 1;
          }
          else {
            *(undefined2 *)((long)local_158.m_p + uVar22 * 2) =
                 *(undefined2 *)
                  (*(long *)CONCAT44(local_68.first.m_pTable._4_4_,(uint)local_68.first.m_pTable) +
                   8 + (ulong)local_68.first.m_index * 0x10);
          }
          uVar28 = (this->m_alpha_selectors).m_size;
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 < uVar28);
    }
  }
  uVar18 = this->m_num_blocks;
  peVar17 = (elemental_vector *)local_98._0_8_;
  uVar28 = *(uint *)(local_98._0_8_ + 8);
  if (uVar28 != uVar18) {
    if (uVar28 <= uVar18) {
      if (*(uint *)(local_98._0_8_ + 0xc) < uVar18) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)local_98._0_8_,uVar18,uVar28 + 1 == uVar18,8,
                   vector<crnlib::dxt_hc::endpoint_indices_details>::object_mover,false);
        uVar28 = *(uint *)((long)peVar17 + 8);
      }
      if (uVar18 - uVar28 != 0) {
        memset((void *)((ulong)uVar28 * 8 + (long)*&peVar17->m_p),0,(ulong)(uVar18 - uVar28) << 3);
      }
    }
    *(uint *)((long)peVar17 + 8) = uVar18;
    uVar18 = this->m_num_blocks;
  }
  uVar28 = selector_indices->m_size;
  if (uVar28 != uVar18) {
    if (uVar28 <= uVar18) {
      if (selector_indices->m_capacity < uVar18) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)selector_indices,uVar18,uVar28 + 1 == uVar18,6,
                   vector<crnlib::dxt_hc::selector_indices_details>::object_mover,false);
        uVar28 = selector_indices->m_size;
      }
      if (uVar18 - uVar28 != 0) {
        memset(selector_indices->m_p + uVar28,0,(((ulong)(uVar18 - uVar28) * 6 - 6) / 6) * 6 + 6);
      }
    }
    selector_indices->m_size = uVar18;
  }
  uVar28 = p->m_num_levels;
  if (uVar28 != 0) {
    local_50 = p->m_levels;
    uVar22 = 0;
    do {
      uVar30 = local_50[uVar22].m_first_block;
      local_b8 = p->m_levels[uVar22].m_num_blocks + uVar30;
      if (uVar30 < local_b8) {
        local_b4 = p->m_levels[uVar22].m_block_width;
        local_38 = (ulong)-local_b4;
        local_40 = (ulong)~local_b4;
        iVar20 = 0;
        do {
          if (local_b4 != 0) {
            bVar24 = iVar20 != 0;
            local_128 = (vector<unsigned_int> *)CONCAT71(local_128._1_7_,bVar24);
            uVar31 = uVar30 - 1;
            uVar21 = -local_b4 + uVar30;
            uVar32 = ~local_b4 + uVar30;
            uVar28 = 0;
            local_b0 = iVar20;
            do {
              bVar23 = uVar28 != 0 || iVar20 != 0;
              bVar11 = this->m_has_subblocks;
              bVar26 = (bool)bVar11 == true && (uVar28 != 0 && iVar20 != 0);
              local_120 = (vector<unsigned_int> *)(ulong)uVar30;
              uVar19 = (ulong)this->m_has_color_blocks ^ 1;
              local_c8 = CONCAT44(local_c8._4_4_,uVar21);
              bVar25 = bVar24;
              if ((uint)uVar19 < this->m_num_alpha_blocks + 1) {
                local_ac = uVar31;
                do {
                  peVar17 = &local_138;
                  if (uVar19 == 0) {
                    peVar17 = &local_a8;
                  }
                  sVar2 = *(short *)((long)peVar17->m_p +
                                    (ulong)local_110->m_p[(long)local_120].field_0.component[uVar19]
                                    * 2);
                  pvVar5 = *(void **)local_98._0_8_;
                  if (bVar23) {
                    bVar23 = sVar2 == *(short *)((long)pvVar5 + uVar19 * 2 + (ulong)uVar31 * 8);
                  }
                  else {
                    bVar23 = false;
                  }
                  if (bVar25) {
                    bVar25 = sVar2 == *(short *)((long)pvVar5 + uVar19 * 2 + (ulong)uVar21 * 8);
                  }
                  else {
                    bVar25 = false;
                  }
                  if (bVar26) {
                    bVar26 = sVar2 == *(short *)((long)pvVar5 + uVar19 * 2 + (ulong)uVar32 * 8);
                  }
                  else {
                    bVar26 = false;
                  }
                  *(short *)((long)pvVar5 + uVar19 * 2 + (long)local_120 * 8) = sVar2;
                  peVar17 = &local_158;
                  if (uVar19 == 0) {
                    peVar17 = &local_148;
                  }
                  selector_indices->m_p[(long)local_120].field_0.component[uVar19] =
                       *(uint16 *)
                        ((long)peVar17->m_p +
                        (ulong)local_c0->m_p[(long)local_120].field_0.component[uVar19] * 2);
                  uVar19 = uVar19 + 1;
                } while (uVar19 < *local_118 + 1);
                bVar11 = this->m_has_subblocks;
                peVar17 = (elemental_vector *)local_98._0_8_;
              }
              if (((bVar11 & 1) == 0) || ((uVar30 & 1) == 0)) {
                uVar12 = '\x01';
                if ((!bVar23) && (uVar12 = bVar26 * '\x03', bVar25)) {
                  uVar12 = '\x02';
                }
              }
              else {
                uVar12 = local_110->m_p[(long)local_120].reference;
              }
              *(uint8 *)((long)peVar17->m_p + (long)local_120 * 8 + 6) = uVar12;
              uVar28 = uVar28 + 1;
              uVar30 = uVar30 + 1;
              uVar31 = uVar31 + 1;
              uVar21 = uVar21 + 1;
              uVar32 = uVar32 + 1;
            } while (uVar28 != local_b4);
          }
          iVar20 = iVar20 + 1;
        } while (uVar30 < local_b8);
        uVar28 = p->m_num_levels;
        local_48 = uVar22;
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 < uVar28);
  }
  this->m_pTask_pool = (task_pool *)0x0;
  if (local_178._8_4_ == 0) {
    if ((hash_map_type *)local_178._0_8_ != (hash_map_type *)0x0) {
      crnlib_free((void *)local_178._0_8_);
    }
  }
  else {
    if ((hash_map_type *)local_178._0_8_ != (hash_map_type *)0x0) {
      crnlib_free((void *)local_178._0_8_);
    }
    local_168 = 0x20;
    local_160._0_4_ = 0;
    local_160._4_4_ = 0;
  }
  if (local_158.m_p != (void *)0x0) {
    crnlib_free(local_158.m_p);
  }
  if (local_108._8_4_ == 0) {
    if ((hash_map_type *)local_108._0_8_ != (hash_map_type *)0x0) {
      crnlib_free((void *)local_108._0_8_);
    }
  }
  else {
    if ((hash_map_type *)local_108._0_8_ != (hash_map_type *)0x0) {
      crnlib_free((void *)local_108._0_8_);
    }
    local_f8 = 0x20;
    local_f0._0_4_ = 0;
    local_f0._4_4_ = 0;
  }
  if (local_148.m_p != (void *)0x0) {
    crnlib_free(local_148.m_p);
  }
  if (local_e8._8_4_ == 0) {
    if ((hash_map_type *)local_e8._0_8_ != (hash_map_type *)0x0) {
      crnlib_free((void *)local_e8._0_8_);
    }
  }
  else {
    if ((hash_map_type *)local_e8._0_8_ != (hash_map_type *)0x0) {
      crnlib_free((void *)local_e8._0_8_);
    }
    local_d8 = 0x20;
    local_d0._0_4_ = 0;
    local_d0._4_4_ = 0;
  }
  if (local_138.m_p != (void *)0x0) {
    crnlib_free(local_138.m_p);
  }
  if (local_88.m_values.m_size == 0) {
    if (local_88.m_values.m_p != (raw_node *)0x0) {
      crnlib_free(local_88.m_values.m_p);
    }
  }
  else {
    if (local_88.m_values.m_p != (raw_node *)0x0) {
      crnlib_free(local_88.m_values.m_p);
    }
    local_88.m_hash_shift = 0x20;
    local_88.m_num_valid = 0;
    local_88.m_grow_threshold = 0;
  }
  if (local_a8.m_p != (void *)0x0) {
    crnlib_free(local_a8.m_p);
  }
  return true;
}

Assistant:

bool dxt_hc::compress(
    color_quad_u8 (*blocks)[16],
    crnlib::vector<endpoint_indices_details>& endpoint_indices,
    crnlib::vector<selector_indices_details>& selector_indices,
    crnlib::vector<uint32>& color_endpoints,
    crnlib::vector<uint32>& alpha_endpoints,
    crnlib::vector<uint32>& color_selectors,
    crnlib::vector<uint64>& alpha_selectors,
    const params& p
  ) {
  clear();
  m_has_etc_color_blocks = p.m_format == cETC1 || p.m_format == cETC2 || p.m_format == cETC2A || p.m_format == cETC1S || p.m_format == cETC2AS;
  m_has_subblocks = p.m_format == cETC1 || p.m_format == cETC2 || p.m_format == cETC2A;
  m_has_color_blocks = p.m_format == cDXT1 || p.m_format == cDXT5 || m_has_etc_color_blocks;
  m_num_alpha_blocks = p.m_format == cDXT5 || p.m_format == cDXT5A || p.m_format == cETC2A || p.m_format == cETC2AS ? 1 : p.m_format == cDXN_XY || p.m_format == cDXN_YX ? 2 : 0;
  if (!m_has_color_blocks && !m_num_alpha_blocks)
    return false;
  m_blocks = blocks;
  m_main_thread_id = crn_get_current_thread_id();
  m_pTask_pool = p.m_pTask_pool;
  m_params = p;

  uint tile_derating[8] = {0, 1, 1, 2, 2, 2, 2, 3};
  for (uint level = 0; level < p.m_num_levels; level++) {
    float adaptive_tile_color_psnr_derating = p.m_adaptive_tile_color_psnr_derating;
    if (level && adaptive_tile_color_psnr_derating > .25f)
      adaptive_tile_color_psnr_derating = math::maximum(.25f, adaptive_tile_color_psnr_derating / powf(3.0f, static_cast<float>(level)));
    for (uint e = 0; e < 8; e++)
      m_color_derating[level][e] = math::lerp(0.0f, adaptive_tile_color_psnr_derating, tile_derating[e] / 3.0f);
  }
  for (uint e = 0; e < 8; e++)
    m_alpha_derating[e] = math::lerp(0.0f, m_params.m_adaptive_tile_alpha_psnr_derating, tile_derating[e] / 3.0f);
  for (uint i = 0; i < 256; i++)
    m_uint8_to_float[i] = i * 1.0f / 255.0f;

  m_num_blocks = m_params.m_num_blocks;
  m_block_weights.resize(m_num_blocks);
  m_block_encodings.resize(m_num_blocks);
  for (uint c = 0; c < 3; c++)
    m_block_selectors[c].resize(m_num_blocks);
  m_tile_indices.resize(m_num_blocks);
  m_endpoint_indices.resize(m_num_blocks);
  m_selector_indices.resize(m_num_blocks);
  m_tiles.resize(m_num_blocks);

  for (uint level = 0; level < p.m_num_levels; level++) {
    float weight = p.m_levels[level].m_weight;
    for (uint b = p.m_levels[level].m_first_block, bEnd = b + p.m_levels[level].m_num_blocks; b < bEnd; b++)
      m_block_weights[b] = weight;
  }

  for (uint i = 0; i <= m_pTask_pool->get_num_threads(); i++)
    m_pTask_pool->queue_object_task(this, m_has_subblocks ? &dxt_hc::determine_tiles_task_etc : &dxt_hc::determine_tiles_task, i);
  m_pTask_pool->join();

  m_num_tiles = 0;
  for (uint t = 0; t < m_tiles.size(); t++) {
    if (m_tiles[t].pixels.size())
      m_num_tiles++;
  }

  if (m_has_color_blocks)
    determine_color_endpoints();

  if (m_num_alpha_blocks)
    determine_alpha_endpoints();

  if (m_has_color_blocks)
    create_color_selector_codebook();

  if (m_num_alpha_blocks)
    create_alpha_selector_codebook();

  color_endpoints.reserve(color_endpoints.size() + m_color_clusters.size());
  crnlib::vector<uint16> color_endpoints_remap(m_color_clusters.size());
  hash_map<uint32, uint> color_endpoints_map;
  for (uint i = 0; i < m_color_clusters.size(); i++) {
    if (m_color_clusters[i].pixels.size()) {
      uint32 endpoint = m_has_etc_color_blocks ? m_color_clusters[i].first_endpoint :
        dxt1_block::pack_endpoints(m_color_clusters[i].first_endpoint, m_color_clusters[i].second_endpoint);
      hash_map<uint32, uint>::insert_result insert_result = color_endpoints_map.insert(endpoint, color_endpoints.size());
      if (insert_result.second) {
        color_endpoints_remap[i] = color_endpoints.size();
        color_endpoints.push_back(endpoint);
      } else {
        color_endpoints_remap[i] = insert_result.first->second;
      }
    }
  }

  alpha_endpoints.reserve(alpha_endpoints.size() + m_alpha_clusters.size());
  crnlib::vector<uint16> alpha_endpoints_remap(m_alpha_clusters.size());
  hash_map<uint32, uint> alpha_endpoints_map;
  for (uint i = 0; i < m_alpha_clusters.size(); i++) {
    if (m_alpha_clusters[i].pixels.size()) {
      uint32 endpoint = dxt5_block::pack_endpoints(m_alpha_clusters[i].first_endpoint, m_alpha_clusters[i].second_endpoint);
      hash_map<uint32, uint>::insert_result insert_result = alpha_endpoints_map.insert(endpoint, alpha_endpoints.size());
      if (insert_result.second) {
        alpha_endpoints_remap[i] = alpha_endpoints.size();
        alpha_endpoints.push_back(endpoint);
      } else {
        alpha_endpoints_remap[i] = insert_result.first->second;
      }
    }
  }

  color_selectors.reserve(color_selectors.size() + m_color_selectors.size());
  crnlib::vector<uint16> color_selectors_remap(m_color_selectors.size());
  hash_map<uint32, uint> color_selectors_map;
  for (uint i = 0; i < m_color_selectors.size(); i++) {
    if (m_color_selectors_used[i]) {
      hash_map<uint32, uint>::insert_result insert_result = color_selectors_map.insert(m_color_selectors[i], color_selectors.size());
      if (insert_result.second) {
        color_selectors_remap[i] = color_selectors.size();
        color_selectors.push_back(m_color_selectors[i]);
      } else {
        color_selectors_remap[i] = insert_result.first->second;
      }
    }
  }

  alpha_selectors.reserve(alpha_selectors.size() + m_alpha_selectors.size());
  crnlib::vector<uint16> alpha_selectors_remap(m_alpha_selectors.size());
  hash_map<uint64, uint> alpha_selectors_map;
  for (uint i = 0; i < m_alpha_selectors.size(); i++) {
    if (m_alpha_selectors_used[i]) {
      hash_map<uint64, uint>::insert_result insert_result = alpha_selectors_map.insert(m_alpha_selectors[i], alpha_selectors.size());
      if (insert_result.second) {
        alpha_selectors_remap[i] = alpha_selectors.size();
        alpha_selectors.push_back(m_alpha_selectors[i]);
      } else {
        alpha_selectors_remap[i] = insert_result.first->second;
      }
    }
  }

  endpoint_indices.resize(m_num_blocks);
  selector_indices.resize(m_num_blocks);
  for (uint level = 0; level < p.m_num_levels; level++) {
    uint first_block = p.m_levels[level].m_first_block;
    uint end_block = first_block + p.m_levels[level].m_num_blocks;
    uint block_width = p.m_levels[level].m_block_width;
    for (uint by = 0, b = first_block; b < end_block; by++) {
      for (uint bx = 0; bx < block_width; bx++, b++) {
        bool top_match = by != 0;
        bool left_match = top_match || bx;
        bool diag_match = m_has_subblocks && top_match && bx;
        for (uint c = m_has_color_blocks ? 0 : cAlpha0; c < cAlpha0 + m_num_alpha_blocks; c++) {
          uint16 endpoint_index = (c ? alpha_endpoints_remap : color_endpoints_remap)[m_endpoint_indices[b].component[c]];
          left_match = left_match && endpoint_index == endpoint_indices[b - 1].component[c];
          top_match = top_match && endpoint_index == endpoint_indices[b - block_width].component[c];
          diag_match = diag_match && endpoint_index == endpoint_indices[b - block_width - 1].component[c];
          endpoint_indices[b].component[c] = endpoint_index;
          uint16 selector_index = (c ? alpha_selectors_remap : color_selectors_remap)[m_selector_indices[b].component[c]];
          selector_indices[b].component[c] = selector_index;
        }
        endpoint_indices[b].reference = m_has_subblocks && b & 1 ? m_endpoint_indices[b].reference : left_match ? 1 : top_match ? 2 : diag_match ? 3 : 0;
      }
    }
  }

  m_pTask_pool = NULL;
  return true;
}